

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiz-stats.c
# Opt level: O0

void stat_grid_counter_simple(chunk_conflict *c,grid_counts *counts)

{
  int local_1dc;
  undefined1 local_1d8 [4];
  wchar_t i;
  neighbor_counter_pred npreds [1];
  grid_counter_pred gpreds [13];
  grid_counts *counts_local;
  chunk_conflict *c_local;
  
  memcpy(npreds[0].other_histogram + 8,&PTR_square_isfloor_003631a0,0x138);
  memcpy(local_1d8,&PTR_is_easily_traversed_003632e0,0x80);
  stat_grid_counter(c,(grid_counter_pred *)(npreds[0].other_histogram + 8),L'\r',
                    (neighbor_counter_pred *)local_1d8,L'\x01');
  counts->floor = (wchar_t)gpreds[0].pred;
  counts->upstair = (wchar_t)gpreds[1].pred;
  counts->downstair = (wchar_t)gpreds[2].pred;
  counts->trap = (wchar_t)gpreds[3].pred;
  counts->lava = (wchar_t)gpreds[4].pred;
  counts->impass_rubble = (wchar_t)gpreds[5].pred;
  counts->pass_rubble = (wchar_t)gpreds[6].pred;
  counts->magma_treasure = (wchar_t)gpreds[7].pred;
  counts->quartz_treasure = (wchar_t)gpreds[8].pred;
  counts->open_door = (wchar_t)gpreds[9].pred;
  counts->closed_door = (wchar_t)gpreds[10].pred;
  counts->broken_door = (wchar_t)gpreds[0xb].pred;
  counts->secret_door = (wchar_t)gpreds[0xc].pred;
  for (local_1dc = 0; local_1dc < 9; local_1dc = local_1dc + 1) {
    counts->traversable_neighbor_histogram[local_1dc] =
         npreds[0].vault_histogram[(long)local_1dc + -2];
  }
  counts[1].floor = gpreds[0].pred._4_4_;
  counts[1].upstair = gpreds[1].pred._4_4_;
  counts[1].downstair = gpreds[2].pred._4_4_;
  counts[1].trap = gpreds[3].pred._4_4_;
  counts[1].lava = gpreds[4].pred._4_4_;
  counts[1].impass_rubble = gpreds[5].pred._4_4_;
  counts[1].pass_rubble = gpreds[6].pred._4_4_;
  counts[1].magma_treasure = gpreds[7].pred._4_4_;
  counts[1].quartz_treasure = gpreds[8].pred._4_4_;
  counts[1].open_door = gpreds[9].pred._4_4_;
  counts[1].closed_door = gpreds[10].pred._4_4_;
  counts[1].broken_door = gpreds[0xb].pred._4_4_;
  counts[1].secret_door = gpreds[0xc].pred._4_4_;
  for (local_1dc = 0; local_1dc < 9; local_1dc = local_1dc + 1) {
    counts[1].traversable_neighbor_histogram[local_1dc] =
         npreds[0].vault_histogram[(long)local_1dc + 7];
  }
  counts[2].floor = gpreds[0].in_vault_count;
  counts[2].upstair = gpreds[1].in_vault_count;
  counts[2].downstair = gpreds[2].in_vault_count;
  counts[2].trap = gpreds[3].in_vault_count;
  counts[2].lava = gpreds[4].in_vault_count;
  counts[2].impass_rubble = gpreds[5].in_vault_count;
  counts[2].pass_rubble = gpreds[6].in_vault_count;
  counts[2].magma_treasure = gpreds[7].in_vault_count;
  counts[2].quartz_treasure = gpreds[8].in_vault_count;
  counts[2].open_door = gpreds[9].in_vault_count;
  counts[2].closed_door = gpreds[10].in_vault_count;
  counts[2].broken_door = gpreds[0xb].in_vault_count;
  counts[2].secret_door = gpreds[0xc].in_vault_count;
  for (local_1dc = 0; local_1dc < 9; local_1dc = local_1dc + 1) {
    counts[2].traversable_neighbor_histogram[local_1dc] =
         *(wchar_t *)((long)&gpreds[-2].pred + (long)local_1dc * 4);
  }
  return;
}

Assistant:

void stat_grid_counter_simple(struct chunk *c, struct grid_counts counts[3])
{
	struct grid_counter_pred gpreds[] = {
		{ square_isfloor, 0, 0, 0 },
		{ square_isupstairs, 0, 0, 0 },
		{ square_isdownstairs, 0, 0, 0 },
		{ is_floor_trap, 0, 0, 0 },
		{ square_isfiery, 0, 0, 0 },
		{ is_impassable_rubble, 0, 0, 0 },
		{ is_passable_rubble, 0, 0, 0 },
		{ is_magma_treasure, 0, 0, 0 },
		{ is_quartz_treasure, 0, 0, 0 },
		{ square_isopendoor, 0, 0, 0 },
		{ square_iscloseddoor, 0, 0, 0 },
		{ square_isbrokendoor, 0, 0, 0 },
		{ square_issecretdoor, 0, 0, 0 },
	};
	struct neighbor_counter_pred npreds[] = {
		{ is_easily_traversed, is_easily_traversed,
			{ 0, 0, 0, 0, 0, 0, 0, 0, 0 },
			{ 0, 0, 0, 0, 0, 0, 0, 0, 0 },
			{ 0, 0, 0, 0, 0, 0, 0, 0, 0 } },
	};
	int i;

	stat_grid_counter(c, gpreds, (int) N_ELEMENTS(gpreds),
		npreds, (int) N_ELEMENTS(npreds));
	counts[0].floor = gpreds[0].in_vault_count;
	counts[0].upstair = gpreds[1].in_vault_count;
	counts[0].downstair = gpreds[2].in_vault_count;
	counts[0].trap = gpreds[3].in_vault_count;
	counts[0].lava = gpreds[4].in_vault_count;
	counts[0].impass_rubble = gpreds[5].in_vault_count;
	counts[0].pass_rubble = gpreds[6].in_vault_count;
	counts[0].magma_treasure = gpreds[7].in_vault_count;
	counts[0].quartz_treasure = gpreds[8].in_vault_count;
	counts[0].open_door = gpreds[9].in_vault_count;
	counts[0].closed_door = gpreds[10].in_vault_count;
	counts[0].broken_door = gpreds[11].in_vault_count;
	counts[0].secret_door = gpreds[12].in_vault_count;
	for (i = 0; i < 9; ++i) {
		counts[0].traversable_neighbor_histogram[i] =
			npreds[0].vault_histogram[i];
	}
	counts[1].floor = gpreds[0].in_room_count;
	counts[1].upstair = gpreds[1].in_room_count;
	counts[1].downstair = gpreds[2].in_room_count;
	counts[1].trap = gpreds[3].in_room_count;
	counts[1].lava = gpreds[4].in_room_count;
	counts[1].impass_rubble = gpreds[5].in_room_count;
	counts[1].pass_rubble = gpreds[6].in_room_count;
	counts[1].magma_treasure = gpreds[7].in_room_count;
	counts[1].quartz_treasure = gpreds[8].in_room_count;
	counts[1].open_door = gpreds[9].in_room_count;
	counts[1].closed_door = gpreds[10].in_room_count;
	counts[1].broken_door = gpreds[11].in_room_count;
	counts[1].secret_door = gpreds[12].in_room_count;
	for (i = 0; i < 9; ++i) {
		counts[1].traversable_neighbor_histogram[i] =
			npreds[0].room_histogram[i];
	}
	counts[2].floor = gpreds[0].in_other_count;
	counts[2].upstair = gpreds[1].in_other_count;
	counts[2].downstair = gpreds[2].in_other_count;
	counts[2].trap = gpreds[3].in_other_count;
	counts[2].lava = gpreds[4].in_other_count;
	counts[2].impass_rubble = gpreds[5].in_other_count;
	counts[2].pass_rubble = gpreds[6].in_other_count;
	counts[2].magma_treasure = gpreds[7].in_other_count;
	counts[2].quartz_treasure = gpreds[8].in_other_count;
	counts[2].open_door = gpreds[9].in_other_count;
	counts[2].closed_door = gpreds[10].in_other_count;
	counts[2].broken_door = gpreds[11].in_other_count;
	counts[2].secret_door = gpreds[12].in_other_count;
	for (i = 0; i < 9; ++i) {
		counts[2].traversable_neighbor_histogram[i] =
			npreds[0].other_histogram[i];
	}
}